

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::insert
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,size_t index,ValueArg e,size_t count)

{
  char *pcVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  char in_DL;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_RSI;
  long in_RDI;
  char *end;
  char *dst;
  char *local_30;
  size_t count_00;
  undefined7 in_stack_ffffffffffffffe0;
  size_t local_8;
  
  count_00 = CONCAT71(in_register_00000009,in_CL);
  if (count_00 == 0) {
    local_8 = *(size_t *)(in_RDI + 0x10);
  }
  else {
    local_30 = insertSpace(in_RSI,CONCAT17(in_DL,in_stack_ffffffffffffffe0),count_00);
    if (local_30 == (char *)0x0) {
      local_8 = 0xffffffffffffffff;
    }
    else {
      pcVar1 = local_30 + count_00;
      for (; local_30 < pcVar1; local_30 = local_30 + 1) {
        *local_30 = in_DL;
      }
      local_8 = *(size_t *)(in_RDI + 0x10);
    }
  }
  return local_8;
}

Assistant:

size_t
	insert(
		size_t index,
		ValueArg e,
		size_t count = 1
	) {
		if (count == 0)
			return this->m_count;

		T* dst = insertSpace(index, count);
		if (!dst)
			return -1;

		T* end = dst + count;
		for (; dst < end; dst++)
			*dst = e;

		return this->m_count;
	}